

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

value value_from_string(value v,char *str,size_t length)

{
  value data;
  value v_00;
  long in_RDX;
  long in_RSI;
  value in_RDI;
  size_t size;
  size_t bytes;
  size_t current_size;
  value in_stack_ffffffffffffffb8;
  value local_8;
  
  local_8 = in_RDI;
  if (((in_RDI != (value)0x0) && (in_RSI != 0)) && (in_RDX != 0)) {
    data = (value)value_size(in_stack_ffffffffffffffb8);
    v_00 = (value)(in_RDX + 1);
    if (v_00 <= data) {
      data = v_00;
    }
    local_8 = value_from(v_00,data,(size_t)data);
  }
  return local_8;
}

Assistant:

value value_from_string(value v, const char *str, size_t length)
{
	if (v != NULL && str != NULL && length > 0)
	{
		size_t current_size = value_size(v);

		size_t bytes = length + 1;

		size_t size = (bytes <= current_size) ? bytes : current_size;

		return value_from(v, str, size);
	}

	return v;
}